

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O1

void WebRtcNs_ProcessCore
               (NoiseSuppressionC *self,float **speechFrame,size_t num_bands,float **outFrame)

{
  int iVar1;
  float *pfVar2;
  size_t i;
  long lVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  float (*pafVar8) [256];
  ulong uVar9;
  float **ppfVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  float fVar14;
  float energy;
  float fVar15;
  float fVar16;
  float theFilter [129];
  float winData [256];
  float imag [129];
  float magn [129];
  float fout [160];
  float real [256];
  uint local_110c;
  float **local_10f8;
  float afStack_10e8 [132];
  float local_ed8 [256];
  float local_ad8 [132];
  float local_8c8 [132];
  float local_6b8 [159];
  float afStack_43c [259];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4b9,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  uVar9 = num_bands - 1;
  if (2 < uVar9) {
    __assert_fail("(num_bands - 1) <= NUM_HIGH_BANDS_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4ba,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  if (num_bands < 2) {
    local_110c = 1;
    ppfVar10 = (float **)0x0;
    local_10f8 = (float **)0x0;
    uVar9 = 0;
  }
  else {
    ppfVar10 = speechFrame + 1;
    local_10f8 = outFrame + 1;
    iVar1 = (int)self->magnLen;
    iVar5 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar5 = iVar1;
    }
    local_110c = iVar5 >> 2;
  }
  UpdateBuffer(*speechFrame,self->blockLen,self->anaLen,self->dataBuf);
  if (uVar9 != 0 && 1 < num_bands) {
    pafVar8 = self->dataBufHB;
    uVar11 = 0;
    do {
      UpdateBuffer(ppfVar10[uVar11],self->blockLen,self->anaLen,*pafVar8);
      uVar11 = uVar11 + 1;
      pafVar8 = pafVar8 + 1;
    } while (uVar9 != uVar11);
  }
  uVar11 = self->anaLen;
  fVar15 = 0.0;
  if (uVar11 != 0) {
    pfVar2 = self->window;
    uVar6 = 0;
    do {
      local_ed8[uVar6] = pfVar2[uVar6] * self->dataBuf[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
    fVar15 = 0.0;
    uVar6 = 0;
    do {
      fVar15 = fVar15 + local_ed8[uVar6] * local_ed8[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
  }
  if ((fVar15 != 0.0) || (NAN(fVar15))) {
    FFT(self,local_ed8,uVar11,self->magnLen,afStack_43c + 1,local_ad8,local_8c8);
    iVar1 = self->blockInd;
    if ((iVar1 < 0x32) && (sVar4 = self->magnLen, sVar4 != 0)) {
      sVar7 = 0;
      do {
        self->initMagnEst[sVar7] = local_8c8[sVar7] + self->initMagnEst[sVar7];
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    sVar4 = self->magnLen;
    if (sVar4 != 0) {
      fVar14 = self->overdrive;
      sVar7 = 0;
      do {
        fVar16 = (self->magnPrevProcess[sVar7] / (self->noisePrev[sVar7] + 0.0001)) *
                 self->smooth[sVar7] * 0.98 +
                 (float)((uint)((local_8c8[sVar7] / (self->noise[sVar7] + 0.0001) + -1.0) *
                               0.01999998) & -(uint)(self->noise[sVar7] < local_8c8[sVar7]));
        afStack_10e8[sVar7] = fVar16 / (fVar14 + fVar16);
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
      sVar7 = 0;
      do {
        fVar14 = self->denoiseBound;
        if (afStack_10e8[sVar7] <= fVar14 && fVar14 != afStack_10e8[sVar7]) {
          afStack_10e8[sVar7] = fVar14;
        }
        if (1.0 < afStack_10e8[sVar7]) {
          afStack_10e8[sVar7] = 1.0;
        }
        if (iVar1 < 0x32) {
          fVar16 = (self->initMagnEst[sVar7] - self->overdrive * self->parametricNoise[sVar7]) /
                   (self->initMagnEst[sVar7] + 0.0001);
          if (fVar14 <= fVar16) {
            fVar14 = fVar16;
          }
          fVar16 = 1.0;
          if (fVar14 <= 1.0) {
            fVar16 = fVar14;
          }
          afStack_10e8[sVar7] =
               (afStack_10e8[sVar7] * (float)iVar1 + fVar16 * (float)(0x32 - iVar1)) / 50.0;
        }
        fVar14 = afStack_10e8[sVar7];
        self->smooth[sVar7] = fVar14;
        fVar16 = local_ad8[sVar7];
        afStack_43c[sVar7 + 1] = afStack_43c[sVar7 + 1] * fVar14;
        local_ad8[sVar7] = fVar14 * fVar16;
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    memcpy(self->magnPrevProcess,local_8c8,sVar4 * 4);
    memcpy(self->noisePrev,self->noise,sVar4 * 4);
    sVar7 = self->anaLen;
    if (sVar4 * 2 - 2 != sVar7) {
      __assert_fail("time_data_length == 2 * (magnitude_length - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                    ,0x3a4,
                    "void IFFT(NoiseSuppressionC *, const float *, const float *, size_t, size_t, float *)"
                   );
    }
    local_ed8[0] = afStack_43c[1];
    local_ed8[1] = afStack_43c[sVar4];
    if (1 < sVar4 - 1) {
      lVar3 = 0;
      do {
        local_ed8[lVar3 * 2 + 2] = afStack_43c[lVar3 + 2];
        local_ed8[lVar3 * 2 + 3] = local_ad8[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (sVar4 - 2 != lVar3);
    }
    WebRtc_rdft(sVar7,-1,local_ed8,self->ip,self->wfft);
    if (sVar7 != 0) {
      sVar4 = 0;
      do {
        local_ed8[sVar4] = local_ed8[sVar4] * (2.0 / (float)sVar7);
        sVar4 = sVar4 + 1;
      } while (sVar7 != sVar4);
    }
    fVar14 = 1.0;
    if ((self->gainmap == 1) && (200 < self->blockInd)) {
      fVar16 = 0.0;
      fVar14 = 0.0;
      if (self->anaLen != 0) {
        sVar4 = 0;
        do {
          fVar16 = fVar16 + local_ed8[sVar4] * local_ed8[sVar4];
          sVar4 = sVar4 + 1;
          fVar14 = fVar16;
        } while (self->anaLen != sVar4);
      }
      fVar14 = fVar14 / (fVar15 + 1.0);
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar16 = 1.0;
      fVar15 = fVar16;
      if ((0.5 < fVar14) && (fVar15 = (fVar14 + -0.5) * 1.3 + 1.0, 1.0 < fVar14 * fVar15)) {
        fVar15 = 1.0 / fVar14;
      }
      if (fVar14 < 0.5) {
        uVar12 = -(uint)(fVar14 <= self->denoiseBound);
        fVar16 = (0.5 - (float)(~uVar12 & (uint)fVar14 | (uint)self->denoiseBound & uVar12)) * -0.3
                 + 1.0;
      }
      fVar14 = fVar15 * self->priorSpeechProb + (1.0 - self->priorSpeechProb) * fVar16;
    }
    uVar11 = self->anaLen;
    if (uVar11 != 0) {
      pfVar2 = self->window;
      uVar6 = 0;
      do {
        local_ed8[uVar6] = pfVar2[uVar6] * local_ed8[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
      uVar6 = 0;
      do {
        self->syntBuf[uVar6] = local_ed8[uVar6] * fVar14 + self->syntBuf[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
    }
    sVar4 = self->blockLen;
    uVar6 = self->windShift;
    if (uVar6 < uVar6 + sVar4) {
      memcpy(local_6b8,self->syntBuf + uVar6,sVar4 * 4);
    }
    if (sVar4 * 2 < uVar11 || sVar4 * 2 - uVar11 == 0) goto LAB_00184c59;
    memcpy(self->syntBuf,self->syntBuf + sVar4,(uVar11 - sVar4) * 4);
    memset((void *)((long)self + sVar4 * -4 + uVar11 * 4 + 0x838),0,sVar4 * 4);
    sVar4 = self->blockLen;
    if (sVar4 != 0) {
      pfVar2 = *outFrame;
      sVar7 = 0;
      do {
        fVar15 = local_6b8[sVar7];
        fVar14 = 32767.0;
        if ((fVar15 <= 32767.0) && (fVar14 = -32768.0, -32768.0 <= fVar15)) {
          fVar14 = fVar15;
        }
        pfVar2[sVar7] = fVar14;
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    if (1 < num_bands) {
      sVar4 = self->magnLen;
      fVar15 = 0.0;
      uVar6 = (long)(int)~local_110c + sVar4;
      for (uVar11 = uVar6; uVar11 < sVar4 - 1; uVar11 = uVar11 + 1) {
        fVar15 = fVar15 + self->speechProb[uVar11];
      }
      if (sVar4 == 0) {
        fVar14 = NAN;
      }
      else {
        fVar14 = 0.0;
        sVar7 = 0;
        fVar16 = 0.0;
        do {
          fVar16 = fVar16 + self->magnPrevAnalyze[sVar7];
          fVar14 = fVar14 + self->magnPrevProcess[sVar7];
          sVar7 = sVar7 + 1;
        } while (sVar4 != sVar7);
        fVar14 = fVar14 / fVar16;
      }
      fVar14 = (fVar15 / (float)(int)local_110c) * fVar14;
      fVar15 = 0.0;
      for (; uVar6 < sVar4 - 1; uVar6 = uVar6 + 1) {
        fVar15 = fVar15 + self->smooth[uVar6];
      }
      dVar13 = tanh((double)(fVar14 + fVar14 + -1.0));
      if (uVar9 != 0) {
        fVar15 = fVar15 / (float)(int)local_110c;
        fVar16 = ((float)dVar13 + 1.0) * 0.5;
        fVar14 = (float)(~-(uint)(fVar14 < 0.5) & (uint)(fVar16 * 0.25 + fVar15 * 0.75) |
                        (uint)(fVar16 * 0.5 + fVar15 * 0.5) & -(uint)(fVar14 < 0.5));
        fVar15 = self->denoiseBound;
        if (self->denoiseBound <= fVar14) {
          fVar15 = fVar14;
        }
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        sVar4 = self->blockLen;
        pafVar8 = self->dataBufHB;
        uVar11 = 0;
        do {
          if (sVar4 != 0) {
            pfVar2 = local_10f8[uVar11];
            sVar7 = 0;
            do {
              fVar16 = (*pafVar8)[sVar7] * fVar14;
              fVar15 = 32767.0;
              if ((fVar16 <= 32767.0) && (fVar15 = -32768.0, -32768.0 <= fVar16)) {
                fVar15 = fVar16;
              }
              pfVar2[sVar7] = fVar15;
              sVar7 = sVar7 + 1;
            } while (sVar4 != sVar7);
          }
          uVar11 = uVar11 + 1;
          pafVar8 = pafVar8 + 1;
        } while (uVar11 != uVar9);
      }
    }
  }
  else {
    sVar4 = self->blockLen;
    uVar6 = self->windShift;
    if (uVar6 < uVar6 + sVar4) {
      memcpy(local_6b8,self->syntBuf + uVar6,sVar4 * 4);
    }
    if (sVar4 * 2 < uVar11 || sVar4 * 2 - uVar11 == 0) {
LAB_00184c59:
      __assert_fail("buffer_length < 2 * frame_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                    ,0x35c,"void UpdateBuffer(const float *, size_t, size_t, float *)");
    }
    memcpy(self->syntBuf,self->syntBuf + sVar4,(uVar11 - sVar4) * 4);
    memset((void *)((long)self + sVar4 * -4 + uVar11 * 4 + 0x838),0,sVar4 * 4);
    sVar4 = self->blockLen;
    if (sVar4 != 0) {
      pfVar2 = *outFrame;
      sVar7 = 0;
      do {
        fVar15 = local_6b8[sVar7];
        fVar14 = 32767.0;
        if ((fVar15 <= 32767.0) && (fVar14 = -32768.0, -32768.0 <= fVar15)) {
          fVar14 = fVar15;
        }
        pfVar2[sVar7] = fVar14;
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    if (uVar9 != 0 && 1 < num_bands) {
      pafVar8 = self->dataBufHB;
      uVar11 = 0;
      do {
        if (sVar4 != 0) {
          pfVar2 = local_10f8[uVar11];
          sVar7 = 0;
          do {
            fVar15 = (*pafVar8)[sVar7];
            fVar14 = 32767.0;
            if ((fVar15 <= 32767.0) && (fVar14 = -32768.0, -32768.0 <= fVar15)) {
              fVar14 = fVar15;
            }
            pfVar2[sVar7] = fVar14;
            sVar7 = sVar7 + 1;
          } while (sVar4 != sVar7);
        }
        uVar11 = uVar11 + 1;
        pafVar8 = pafVar8 + 1;
      } while (uVar11 != uVar9);
    }
  }
  return;
}

Assistant:

void WebRtcNs_ProcessCore(NoiseSuppressionC* self,
                          const float* const* speechFrame,
                          size_t num_bands,
                          float* const* outFrame) {
  // Main routine for noise reduction.
  int flagHB = 0;
  size_t i, j;

  float energy1, energy2, gain, factor, factor1, factor2;
  float fout[BLOCKL_MAX];
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL];
  float theFilter[HALF_ANAL_BLOCKL], theFilterTmp[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];

  // SWB variables.
  int deltaBweHB = 1;
  int deltaGainHB = 1;
  float decayBweHB = 1.0;
  float gainMapParHB = 1.0;
  float gainTimeDomainHB = 1.0;
  float avgProbSpeechHB, avgProbSpeechHBTmp, avgFilterGainHB, gainModHB;
  float sumMagnAnalyze, sumMagnProcess;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  assert((num_bands - 1) <= NUM_HIGH_BANDS_MAX);

  const float* const* speechFrameHB = NULL;
  float* const* outFrameHB = NULL;
  size_t num_high_bands = 0;
  if (num_bands > 1) {
    speechFrameHB = &speechFrame[1];
    outFrameHB = &outFrame[1];
    num_high_bands = num_bands - 1;
    flagHB = 1;
    // Range for averaging low band quantities for H band gain.
    deltaBweHB = (int)self->magnLen / 4;
    deltaGainHB = deltaBweHB;
  }

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame[0], self->blockLen, self->anaLen, self->dataBuf);

  if (flagHB == 1) {
    // Update analysis buffer for H bands.
    for (i = 0; i < num_high_bands; ++i) {
      UpdateBuffer(speechFrameHB[i],
                   self->blockLen,
                   self->anaLen,
                   self->dataBufHB[i]);
    }
  }

  Windowing(self->window, self->dataBuf, self->anaLen, winData);
  energy1 = Energy(winData, self->anaLen);
  if (energy1 == 0.0) {
    // Synthesize the special case of zero input.
    // Read out fully processed segment.
    for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
      fout[i - self->windShift] = self->syntBuf[i];
    }
    // Update synthesis buffer.
    UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

    for (i = 0; i < self->blockLen; ++i)
      outFrame[0][i] =
          WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

    // For time-domain gain of HB.
    if (flagHB == 1) {
      for (i = 0; i < num_high_bands; ++i) {
        for (j = 0; j < self->blockLen; ++j) {
          outFrameHB[i][j] = WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                                            self->dataBufHB[i][j],
                                            WEBRTC_SPL_WORD16_MIN);
        }
      }
    }

    return;
  }

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  if (self->blockInd < END_STARTUP_SHORT) {
    for (i = 0; i < self->magnLen; i++) {
      self->initMagnEst[i] += magn[i];
    }
  }

  ComputeDdBasedWienerFilter(self, magn, theFilter);

  for (i = 0; i < self->magnLen; i++) {
    // Flooring bottom.
    if (theFilter[i] < self->denoiseBound) {
      theFilter[i] = self->denoiseBound;
    }
    // Flooring top.
    if (theFilter[i] > 1.f) {
      theFilter[i] = 1.f;
    }
    if (self->blockInd < END_STARTUP_SHORT) {
      theFilterTmp[i] =
          (self->initMagnEst[i] - self->overdrive * self->parametricNoise[i]);
      theFilterTmp[i] /= (self->initMagnEst[i] + 0.0001f);
      // Flooring bottom.
      if (theFilterTmp[i] < self->denoiseBound) {
        theFilterTmp[i] = self->denoiseBound;
      }
      // Flooring top.
      if (theFilterTmp[i] > 1.f) {
        theFilterTmp[i] = 1.f;
      }
      // Weight the two suppression filters.
      theFilter[i] *= (self->blockInd);
      theFilterTmp[i] *= (END_STARTUP_SHORT - self->blockInd);
      theFilter[i] += theFilterTmp[i];
      theFilter[i] /= (END_STARTUP_SHORT);
    }

    self->smooth[i] = theFilter[i];
    real[i] *= self->smooth[i];
    imag[i] *= self->smooth[i];
  }
  // Keep track of |magn| spectrum for next frame.
  memcpy(self->magnPrevProcess, magn, sizeof(*magn) * self->magnLen);
  memcpy(self->noisePrev, self->noise, sizeof(self->noise[0]) * self->magnLen);
  // Back to time domain.
  IFFT(self, real, imag, self->magnLen, self->anaLen, winData);

  // Scale factor: only do it after END_STARTUP_LONG time.
  factor = 1.f;
  if (self->gainmap == 1 && self->blockInd > END_STARTUP_LONG) {
    factor1 = 1.f;
    factor2 = 1.f;

    energy2 = Energy(winData, self->anaLen);
    gain = (float)sqrt(energy2 / (energy1 + 1.f));

    // Scaling for new version.
    if (gain > B_LIM) {
      factor1 = 1.f + 1.3f * (gain - B_LIM);
      if (gain * factor1 > 1.f) {
        factor1 = 1.f / gain;
      }
    }
    if (gain < B_LIM) {
      // Don't reduce scale too much for pause regions:
      // attenuation here should be controlled by flooring.
      if (gain <= self->denoiseBound) {
        gain = self->denoiseBound;
      }
      factor2 = 1.f - 0.3f * (B_LIM - gain);
    }
    // Combine both scales with speech/noise prob:
    // note prior (priorSpeechProb) is not frequency dependent.
    factor = self->priorSpeechProb * factor1 +
             (1.f - self->priorSpeechProb) * factor2;
  }  // Out of self->gainmap == 1.

  Windowing(self->window, winData, self->anaLen, winData);

  // Synthesis.
  for (i = 0; i < self->anaLen; i++) {
    self->syntBuf[i] += factor * winData[i];
  }
  // Read out fully processed segment.
  for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
    fout[i - self->windShift] = self->syntBuf[i];
  }
  // Update synthesis buffer.
  UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

  for (i = 0; i < self->blockLen; ++i)
    outFrame[0][i] =
        WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

  // For time-domain gain of HB.
  if (flagHB == 1) {
    // Average speech prob from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgProbSpeechHB = 0.0;
    for (i = self->magnLen - deltaBweHB - 1; i < self->magnLen - 1; i++) {
      avgProbSpeechHB += self->speechProb[i];
    }
    avgProbSpeechHB = avgProbSpeechHB / ((float)deltaBweHB);
    // If the speech was suppressed by a component between Analyze and
    // Process, for example the AEC, then it should not be considered speech
    // for high band suppression purposes.
    sumMagnAnalyze = 0;
    sumMagnProcess = 0;
    for (i = 0; i < self->magnLen; ++i) {
      sumMagnAnalyze += self->magnPrevAnalyze[i];
      sumMagnProcess += self->magnPrevProcess[i];
    }
    avgProbSpeechHB *= sumMagnProcess / sumMagnAnalyze;
    // Average filter gain from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgFilterGainHB = 0.0;
    for (i = self->magnLen - deltaGainHB - 1; i < self->magnLen - 1; i++) {
      avgFilterGainHB += self->smooth[i];
    }
    avgFilterGainHB = avgFilterGainHB / ((float)(deltaGainHB));
    avgProbSpeechHBTmp = 2.f * avgProbSpeechHB - 1.f;
    // Gain based on speech probability.
    gainModHB = 0.5f * (1.f + (float)tanh(gainMapParHB * avgProbSpeechHBTmp));
    // Combine gain with low band gain.
    gainTimeDomainHB = 0.5f * gainModHB + 0.5f * avgFilterGainHB;
    if (avgProbSpeechHB >= 0.5f) {
      gainTimeDomainHB = 0.25f * gainModHB + 0.75f * avgFilterGainHB;
    }
    gainTimeDomainHB = gainTimeDomainHB * decayBweHB;
    // Make sure gain is within flooring range.
    // Flooring bottom.
    if (gainTimeDomainHB < self->denoiseBound) {
      gainTimeDomainHB = self->denoiseBound;
    }
    // Flooring top.
    if (gainTimeDomainHB > 1.f) {
      gainTimeDomainHB = 1.f;
    }
    // Apply gain.
    for (i = 0; i < num_high_bands; ++i) {
      for (j = 0; j < self->blockLen; j++) {
        outFrameHB[i][j] =
            WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                           gainTimeDomainHB * self->dataBufHB[i][j],
                           WEBRTC_SPL_WORD16_MIN);
      }
    }
  }  // End of H band gain computation.
}